

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

CTextureHandle __thiscall
CGraphics_Threaded::LoadTexture
          (CGraphics_Threaded *this,char *pFilename,int StorageType,int StoreFormat,int Flags)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int l;
  CImageInfo Img;
  CTextureHandle ID;
  int local_48;
  undefined4 local_28;
  undefined4 local_24;
  int local_20;
  undefined8 local_18;
  CTextureHandle local_10;
  CTextureHandle local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = str_length((char *)0x12ef21);
  IGraphics::CTextureHandle::CTextureHandle(&local_10);
  if (iVar1 < 3) {
    IGraphics::CTextureHandle::CTextureHandle(&local_c);
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x70))(in_RDI,&local_28,in_RSI,in_EDX);
    if (iVar1 == 0) {
      local_c.m_Id = *(int *)((long)in_RDI + 0x1201a4);
    }
    else {
      local_48 = in_ECX;
      if (in_ECX == -1) {
        local_48 = local_20;
      }
      local_10.m_Id =
           (**(code **)(*in_RDI + 0x80))(in_RDI,local_28,local_24,local_20,local_18,local_48,in_R8D)
      ;
      mem_free((void *)0x12efb9);
      iVar1 = IGraphics::CTextureHandle::Id(&local_10);
      iVar2 = IGraphics::CTextureHandle::Id((CTextureHandle *)((long)in_RDI + 0x1201a4));
      if ((iVar1 != iVar2) && (*(int *)(in_RDI[0x12] + 0x1264) != 0)) {
        dbg_msg("graphics/texture","loaded %s",in_RSI);
      }
      local_c.m_Id = local_10.m_Id;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (CTextureHandle)local_c.m_Id;
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CGraphics_Threaded::LoadTexture(const char *pFilename, int StorageType, int StoreFormat, int Flags)
{
	int l = str_length(pFilename);
	IGraphics::CTextureHandle ID;
	CImageInfo Img;

	if(l < 3)
		return CTextureHandle();
	if(LoadPNG(&Img, pFilename, StorageType))
	{
		if (StoreFormat == CImageInfo::FORMAT_AUTO)
			StoreFormat = Img.m_Format;

		ID = LoadTextureRaw(Img.m_Width, Img.m_Height, Img.m_Format, Img.m_pData, StoreFormat, Flags);
		mem_free(Img.m_pData);
		if(ID.Id() != m_InvalidTexture.Id() && m_pConfig->m_Debug)
			dbg_msg("graphics/texture", "loaded %s", pFilename);
		return ID;
	}

	return m_InvalidTexture;
}